

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O0

void __thiscall QSystemTrayIconPrivate::remove_sys_qpa(QSystemTrayIconPrivate *this)

{
  QObject *pQVar1;
  QSystemTrayIconPrivate *in_RDI;
  offset_in_QPlatformSystemTrayIcon_to_subr unaff_retaddr;
  QPlatformSystemTrayIcon *receiver;
  QPlatformSystemTrayIcon *sender;
  
  receiver = in_RDI->qpa_sys;
  pQVar1 = &q_func(in_RDI)->super_QObject;
  QObject::disconnect((QObject *)receiver,"2activated(QPlatformSystemTrayIcon::ActivationReason)",
                      pQVar1,"1_q_emitActivated(QPlatformSystemTrayIcon::ActivationReason)");
  sender = in_RDI->qpa_sys;
  q_func(in_RDI);
  QObject::disconnect<void(QPlatformSystemTrayIcon::*)(),void(QSystemTrayIcon::*)()>
            (sender,unaff_retaddr,(Object *)receiver,0);
  (**(code **)(*(long *)in_RDI->qpa_sys + 0x68))();
  return;
}

Assistant:

void QSystemTrayIconPrivate::remove_sys_qpa()
{
    QObject::disconnect(qpa_sys, SIGNAL(activated(QPlatformSystemTrayIcon::ActivationReason)),
                        q_func(), SLOT(_q_emitActivated(QPlatformSystemTrayIcon::ActivationReason)));
    QObject::disconnect(qpa_sys, &QPlatformSystemTrayIcon::messageClicked,
                        q_func(), &QSystemTrayIcon::messageClicked);
    qpa_sys->cleanup();
}